

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

bool __thiscall wasm::Literal::operator==(Literal *this,Literal *other)

{
  Type *this_00;
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  uintptr_t in_RAX;
  HeapType HVar5;
  undefined1 auVar6 [16];
  HeapType local_28;
  
  uVar1 = (this->type).id;
  if (uVar1 != (other->type).id) {
    return false;
  }
  if (uVar1 < 7) {
    switch(uVar1 & 0xffffffff) {
    case 0:
      bVar4 = true;
      break;
    default:
switchD_00936125_caseD_1:
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x1bf);
    case 2:
    case 4:
      goto switchD_00936125_caseD_2;
    case 3:
    case 5:
switchD_00936125_caseD_3:
      bVar4 = (this->field_0).i64 == (other->field_0).i64;
      break;
    case 6:
      auVar6[0] = -((other->field_0).v128[0] == (this->field_0).v128[0]);
      auVar6[1] = -((other->field_0).v128[1] == (this->field_0).v128[1]);
      auVar6[2] = -((other->field_0).v128[2] == (this->field_0).v128[2]);
      auVar6[3] = -((other->field_0).v128[3] == (this->field_0).v128[3]);
      auVar6[4] = -((other->field_0).v128[4] == (this->field_0).v128[4]);
      auVar6[5] = -((other->field_0).v128[5] == (this->field_0).v128[5]);
      auVar6[6] = -((other->field_0).v128[6] == (this->field_0).v128[6]);
      auVar6[7] = -((other->field_0).v128[7] == (this->field_0).v128[7]);
      auVar6[8] = -((other->field_0).v128[8] == (this->field_0).v128[8]);
      auVar6[9] = -((other->field_0).v128[9] == (this->field_0).v128[9]);
      auVar6[10] = -((other->field_0).v128[10] == (this->field_0).v128[10]);
      auVar6[0xb] = -((other->field_0).v128[0xb] == (this->field_0).v128[0xb]);
      auVar6[0xc] = -((other->field_0).v128[0xc] == (this->field_0).v128[0xc]);
      auVar6[0xd] = -((other->field_0).v128[0xd] == (this->field_0).v128[0xd]);
      auVar6[0xe] = -((other->field_0).v128[0xe] == (this->field_0).v128[0xe]);
      auVar6[0xf] = -((other->field_0).v128[0xf] == (this->field_0).v128[0xf]);
      bVar4 = (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar6[0xf] >> 7) << 0xf) == 0xffff;
    }
  }
  else {
    this_00 = &this->type;
    local_28.id = in_RAX;
    bVar4 = wasm::Type::isRef(this_00);
    if (!bVar4) goto switchD_00936125_caseD_1;
    bVar4 = wasm::Type::isRef(this_00);
    if (!bVar4) {
      __assert_fail("type.isRef()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                    ,0x1ac,"bool wasm::Literal::operator==(const Literal &) const");
    }
    bVar4 = wasm::Type::isRef(this_00);
    if (bVar4) {
      local_28 = wasm::Type::getHeapType(this_00);
      bVar4 = HeapType::isBottom(&local_28);
      if (bVar4) {
        return true;
      }
    }
    bVar4 = wasm::Type::isFunction(this_00);
    if (bVar4) {
      pcVar2 = (this->field_0).func.super_IString.str._M_str;
      if ((pcVar2 != (char *)0x0) &&
         (pcVar3 = (other->field_0).func.super_IString.str._M_str, pcVar3 != (char *)0x0)) {
        return pcVar2 == pcVar3;
      }
      __assert_fail("func.is() && other.func.is()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                    ,0x1b1,"bool wasm::Literal::operator==(const Literal &) const");
    }
    bVar4 = wasm::Type::isString(this_00);
    if (bVar4) {
      bVar4 = SmallVector<wasm::Literal,_1UL>::operator==
                        (&(((this->field_0).gcData.
                            super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          values).super_SmallVector<wasm::Literal,_1UL>,
                         &(((other->field_0).gcData.
                            super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          values).super_SmallVector<wasm::Literal,_1UL>);
      return bVar4;
    }
    bVar4 = wasm::Type::isData(this_00);
    if (bVar4) goto switchD_00936125_caseD_3;
    HVar5 = wasm::Type::getHeapType(this_00);
    if (HVar5.id != 4) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x1bd);
    }
switchD_00936125_caseD_2:
    bVar4 = (this->field_0).i32 == (other->field_0).i32;
  }
  return bVar4;
}

Assistant:

bool Literal::operator==(const Literal& other) const {
  if (type != other.type) {
    return false;
  }
  if (type.isBasic()) {
    switch (type.getBasic()) {
      case Type::none:
        return true; // special voided literal
      case Type::i32:
      case Type::f32:
        return i32 == other.i32;
      case Type::i64:
      case Type::f64:
        return i64 == other.i64;
      case Type::v128:
        return memcmp(v128, other.v128, 16) == 0;
      case Type::unreachable:
        break;
    }
  } else if (type.isRef()) {
    assert(type.isRef());
    if (type.isNull()) {
      return true;
    }
    if (type.isFunction()) {
      assert(func.is() && other.func.is());
      return func == other.func;
    }
    if (type.isString()) {
      return gcData->values == other.gcData->values;
    }
    if (type.isData()) {
      return gcData == other.gcData;
    }
    if (type.getHeapType() == HeapType::i31) {
      return i32 == other.i32;
    }
    WASM_UNREACHABLE("unexpected type");
  }
  WASM_UNREACHABLE("unexpected type");
}